

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::QueueDimensionSpecifierSyntax::setChild
          (QueueDimensionSpecifierSyntax *this,size_t index,TokenOrSyntax child)

{
  undefined8 uVar1;
  SyntaxNode *pSVar2;
  ColonExpressionClauseSyntax *pCVar3;
  logic_error *this_00;
  long lVar4;
  Token TVar5;
  allocator<char> local_e1;
  string local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if (index == 1) {
    pSVar2 = TokenOrSyntax::node(&child);
    lVar4 = 0x20;
    if (pSVar2 == (SyntaxNode *)0x0) {
      pCVar3 = (ColonExpressionClauseSyntax *)0x0;
    }
    else {
      pSVar2 = TokenOrSyntax::node(&child);
      pCVar3 = SyntaxNode::as<slang::syntax::ColonExpressionClauseSyntax>(pSVar2);
    }
  }
  else {
    if (index != 0) {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O2/extern/slang/source/AllSyntax.cpp"
                 ,&local_e1);
      std::operator+(&local_a0,&local_c0,":");
      std::__cxx11::to_string(&local_e0,0x2a4c);
      std::operator+(&local_80,&local_a0,&local_e0);
      std::operator+(&local_60,&local_80,": ");
      std::operator+(&local_40,&local_60,"Default case should be unreachable!");
      std::logic_error::logic_error(this_00,(string *)&local_40);
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    TVar5 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    pCVar3 = (ColonExpressionClauseSyntax *)TVar5.info;
    uVar1 = TVar5._0_8_;
    (this->dollar).kind = (short)uVar1;
    (this->dollar).field_0x2 = (char)((ulong)uVar1 >> 0x10);
    (this->dollar).numFlags = (NumericTokenFlags)(char)((ulong)uVar1 >> 0x18);
    (this->dollar).rawLen = (int)((ulong)uVar1 >> 0x20);
    lVar4 = 0x18;
  }
  *(ColonExpressionClauseSyntax **)
   ((long)&(this->super_DimensionSpecifierSyntax).super_SyntaxNode.parent + lVar4) = pCVar3;
  return;
}

Assistant:

void QueueDimensionSpecifierSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: dollar = child.token(); return;
        case 1: maxSizeClause = child.node() ? &child.node()->as<ColonExpressionClauseSyntax>() : nullptr; return;
        default: ASSUME_UNREACHABLE;
    }
}